

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O2

void gl3cts::TextureSwizzle::calculate_expected_value
               (size_t source_format_idx,size_t output_format_idx,size_t index_of_swizzled_channel,
               GLint source_size,GLint output_size,void *out_expected_data_low,
               void *out_expected_data_top,size_t *out_expected_data_size)

{
  void *__src;
  _out_ch_desc *p_Var1;
  TestError *this;
  int *ptr;
  float fVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  size_t sStack_a0;
  int local_90;
  double ch_rgba [4];
  
  p_Var1 = get_descriptor_for_channel
                     ((_texture_format *)(&texture_formats + source_format_idx * 0x1e),
                      index_of_swizzled_channel);
  if (0xb < *(int *)(&DAT_01e8340c + output_format_idx * 0x78) - 0x1400U) {
switchD_0092bf79_caseD_1407:
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
               ,0x6be);
    goto LAB_0092c284;
  }
  __src = p_Var1->m_expected_data;
  dVar5 = 0.0;
  sStack_a0 = 1;
  local_90 = output_size;
  switch(*(int *)(&DAT_01e8340c + output_format_idx * 0x78)) {
  case 0x1400:
    dVar5 = -127.0;
    dVar11 = 127.0;
    break;
  case 0x1401:
    dVar11 = 255.0;
    goto LAB_0092c002;
  case 0x1402:
    dVar5 = -32767.0;
    dVar11 = 32767.0;
    sStack_a0 = 2;
    break;
  case 0x1403:
    dVar11 = 65535.0;
    goto LAB_0092bfe4;
  case 0x1404:
    dVar5 = -2147483647.0;
    dVar11 = 2147483647.0;
    sStack_a0 = 4;
    break;
  case 0x1405:
    dVar11 = 4294967295.0;
    goto LAB_0092bffe;
  case 0x1406:
    dVar11 = 0.0;
LAB_0092bffe:
    sStack_a0 = 4;
    goto LAB_0092c002;
  default:
    goto switchD_0092bf79_caseD_1407;
  case 0x140b:
    dVar11 = 0.0;
LAB_0092bfe4:
    sStack_a0 = 2;
    goto LAB_0092c002;
  }
  source_size = source_size + -1;
  local_90 = output_size + -1;
LAB_0092c002:
  if (__src != (void *)0x0) {
    memcpy(out_expected_data_top,__src,sStack_a0);
    memcpy(out_expected_data_low,__src,sStack_a0);
    *out_expected_data_size = sStack_a0;
    return;
  }
  calculate_values_from_source(source_format_idx,ch_rgba);
  auVar9._8_4_ = source_size >> 0x1f;
  auVar9._0_8_ = (long)source_size;
  auVar9._12_4_ = 0x45300000;
  dVar6 = exp2((auVar9._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,source_size) - 4503599627370496.0));
  fVar2 = (float)(dVar6 + -1.0);
  auVar10._8_4_ = local_90 >> 0x1f;
  auVar10._0_8_ = (long)local_90;
  auVar10._12_4_ = 0x45300000;
  dVar7 = exp2((auVar10._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,local_90) - 4503599627370496.0));
  dVar6 = ch_rgba[index_of_swizzled_channel];
  fVar3 = floorf((float)dVar6 * fVar2 + -1.0);
  fVar4 = ceilf((float)dVar6 * fVar2 + 1.0);
  fVar3 = floorf((fVar3 / fVar2) * (float)(dVar7 + -1.0));
  fVar2 = ceilf((fVar4 / fVar2) * (float)(dVar7 + -1.0));
  if (*(int *)(&DAT_01e8340c + output_format_idx * 0x78) - 0x1400U < 6) {
    dVar8 = (double)fVar3;
    dVar7 = (double)fVar2;
    dVar6 = dVar11;
    if (dVar8 <= dVar11) {
      dVar6 = dVar8;
    }
    if (dVar7 <= dVar11) {
      dVar11 = dVar7;
    }
    (*(code *)(&DAT_0164bc24 +
              *(int *)(&DAT_0164bc24 +
                      (ulong)(*(int *)(&DAT_01e8340c + output_format_idx * 0x78) - 0x1400U) * 4)))
              (-(ulong)(dVar7 < dVar5) & (ulong)dVar5 | ~-(ulong)(dVar7 < dVar5) & (ulong)dVar11,
               -(ulong)(dVar8 < dVar5) & (ulong)dVar5 | ~-(ulong)(dVar8 < dVar5) & (ulong)dVar6);
    return;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,"Invalid enum",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
             ,0x705);
LAB_0092c284:
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void calculate_expected_value(size_t source_format_idx, size_t output_format_idx, size_t index_of_swizzled_channel,
							  glw::GLint source_size, glw::GLint output_size, void* out_expected_data_low,
							  void* out_expected_data_top, size_t& out_expected_data_size)
{
	const _texture_format& output_format = texture_formats[output_format_idx];
	const _texture_format& source_format = texture_formats[source_format_idx];
	const _out_ch_desc&	desc			 = get_descriptor_for_channel(source_format, index_of_swizzled_channel);
	const glw::GLvoid*	 expected_data = desc.m_expected_data;
	bool				   is_signed	 = false;
	double				   range_low	 = 0.0f;
	double				   range_top	 = 0.0f;
	size_t				   texel_size	= 0;

	/* Select range, texel size and is_signed */
	switch (output_format.m_type)
	{
	case GL_BYTE:
		is_signed = true;

		range_low = -127.0;
		range_top = 127.0;

		texel_size = 1;

		break;

	case GL_UNSIGNED_BYTE:
		range_low = 0.0;
		range_top = 255.0;

		texel_size = 1;

		break;

	case GL_SHORT:
		is_signed = true;

		range_low = -32767.0;
		range_top = 32767.0;

		texel_size = 2;

		break;

	case GL_UNSIGNED_SHORT:
		range_low = 0.0;
		range_top = 65535.0;

		texel_size = 2;

		break;

	case GL_HALF_FLOAT:
		texel_size = 2;

		/* Halfs are not calculated, range will not be used */

		break;

	case GL_INT:
		is_signed = true;

		range_low = -2147483647.0;
		range_top = 2147483647.0;

		texel_size = 4;

		break;

	case GL_UNSIGNED_INT:
		range_low = 0.0;
		range_top = 4294967295.0;

		texel_size = 4;

		break;

	case GL_FLOAT:
		texel_size = 4;

		/* Float are not calculated, range will not be used */

		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	/* Signed formats use one bit less */
	if (true == is_signed)
	{
		source_size -= 1;
		output_size -= 1;
	}

	/* If expected data is hardcoded just copy data to low and top */
	if (DE_NULL != expected_data)
	{
		memcpy(out_expected_data_top, expected_data, texel_size);
		memcpy(out_expected_data_low, expected_data, texel_size);
		out_expected_data_size = texel_size;
	}
	else
	{
		/* Get source values */
		double ch_rgba[4];
		calculate_values_from_source(source_format_idx, ch_rgba);

		/* Calculate expected value */
		const float max_internal  = float(calculate_max_for_size(source_size));
		const float max_output	= float(calculate_max_for_size(output_size));
		const float temp_internal = float(ch_rgba[index_of_swizzled_channel]) * max_internal;
		const float stor_internal_low =
			deFloatFloor(temp_internal - 1.0f); /* Offset by 1 to avoid rounding done by FPU */
		const float stor_internal_top =
			deFloatCeil(temp_internal + 1.0f); /* Offset by 1 to avoid rounding done by FPU */
		const float read_internal_low = stor_internal_low / max_internal;
		const float read_internal_top = stor_internal_top / max_internal;
		const float temp_output_low   = read_internal_low * max_output;
		const float temp_output_top   = read_internal_top * max_output;
		double		stor_output_low   = floor(temp_output_low);
		double		stor_output_top   = ceil(temp_output_top);

		/* Clamp to limits of output format */
		stor_output_low = de::clamp(stor_output_low, range_low, range_top);
		stor_output_top = de::clamp(stor_output_top, range_low, range_top);

		/* Store resuts */
		switch (output_format.m_type)
		{
		case GL_BYTE:
			convert<glw::GLbyte>(out_expected_data_low, stor_output_low);
			convert<glw::GLbyte>(out_expected_data_top, stor_output_top);
			break;
		case GL_UNSIGNED_BYTE:
			convert<glw::GLubyte>(out_expected_data_low, stor_output_low);
			convert<glw::GLubyte>(out_expected_data_top, stor_output_top);
			break;
		case GL_SHORT:
			convert<glw::GLshort>(out_expected_data_low, stor_output_low);
			convert<glw::GLshort>(out_expected_data_top, stor_output_top);
			break;
		case GL_UNSIGNED_SHORT:
			convert<glw::GLushort>(out_expected_data_low, stor_output_low);
			convert<glw::GLushort>(out_expected_data_top, stor_output_top);
			break;
		case GL_INT:
			convert<glw::GLint>(out_expected_data_low, stor_output_low);
			convert<glw::GLint>(out_expected_data_top, stor_output_top);
			break;
		case GL_UNSIGNED_INT:
			convert<glw::GLuint>(out_expected_data_low, stor_output_low);
			convert<glw::GLuint>(out_expected_data_top, stor_output_top);
			break;
		default:
			TCU_FAIL("Invalid enum");
			break;
		}
		out_expected_data_size = texel_size;
	}
}